

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteBuffer(CopyingOutputStreamAdaptor *this)

{
  pointer puVar1;
  ulong uVar2;
  long in_RDI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this_00;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    if (*(int *)(in_RDI + 0x2c) == 0) {
      local_1 = true;
    }
    else {
      this_00 = *(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> **)(in_RDI + 8)
      ;
      puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(this_00)
      ;
      uVar2 = (**(code **)((this_00->_M_t).
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x10))
                        (this_00,puVar1,*(undefined4 *)(in_RDI + 0x2c));
      if ((uVar2 & 1) == 0) {
        *(undefined1 *)(in_RDI + 0x11) = 1;
        FreeBuffer((CopyingOutputStreamAdaptor *)0x3e5f62);
        local_1 = false;
      }
      else {
        *(long *)(in_RDI + 0x18) = (long)*(int *)(in_RDI + 0x2c) + *(long *)(in_RDI + 0x18);
        *(undefined4 *)(in_RDI + 0x2c) = 0;
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteBuffer() {
  if (failed_) {
    // Already failed on a previous write.
    return false;
  }

  if (buffer_used_ == 0) return true;

  if (copying_stream_->Write(buffer_.get(), buffer_used_)) {
    position_ += buffer_used_;
    buffer_used_ = 0;
    return true;
  } else {
    failed_ = true;
    FreeBuffer();
    return false;
  }
}